

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O0

vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
* __thiscall
TxOrphanage::GetChildrenFromDifferentPeer(TxOrphanage *this,CTransactionRef *parent,NodeId nodeid)

{
  bool bVar1;
  const_iterator __first;
  _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_> *p_Var2;
  pointer ppVar3;
  iterator iVar4;
  iterator iVar5;
  __normal_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
  _Var6;
  long in_RCX;
  long in_RSI;
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
  *child_iter;
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  *__range1;
  _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_> *elem;
  set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  *__range3;
  uint i;
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  *children_found;
  iterator __end1;
  iterator __begin1;
  iterator __end3;
  iterator __begin3;
  const_iterator it_by_prev;
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  iters;
  undefined4 in_stack_fffffffffffffe68;
  uint32_t in_stack_fffffffffffffe6c;
  OrphanTx *in_stack_fffffffffffffe70;
  COutPoint *in_stack_fffffffffffffe78;
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  *this_00;
  _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
  *in_stack_fffffffffffffe80;
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  *in_stack_fffffffffffffe88;
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  *this_01;
  __normal_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
  in_stack_fffffffffffffe90;
  const_iterator in_stack_fffffffffffffea0;
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  *in_stack_fffffffffffffea8;
  const_iterator in_stack_fffffffffffffeb0;
  uint local_bc;
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  local_48 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ::vector((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_bc = 0;
  while( true ) {
    __first._M_current =
         (_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_> *
         )(ulong)local_bc;
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    p_Var2 = (_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
              *)std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                          ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                           CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    if (p_Var2 <= __first._M_current) break;
    in_stack_fffffffffffffea8 =
         (vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
          *)(in_RSI + 0x60);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    in_stack_fffffffffffffeb0._M_current =
         (_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_> *
         )CTransaction::GetHash
                    ((CTransaction *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    COutPoint::COutPoint
              (in_stack_fffffffffffffe78,(Txid *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c
              );
    in_stack_fffffffffffffea0 =
         std::
         map<COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
         ::find((map<COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
                 *)in_stack_fffffffffffffe70,
                (key_type *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    std::
    map<COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
    ::end((map<COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
           *)in_stack_fffffffffffffe70);
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe78,(_Self *)in_stack_fffffffffffffe70);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      _Rb_tree_const_iterator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      std::
      set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
      ::begin((set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
               *)in_stack_fffffffffffffe70);
      std::
      set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
      ::end((set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
             *)in_stack_fffffffffffffe70);
      while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe78,
                                     (_Self *)in_stack_fffffffffffffe70), ((bVar1 ^ 0xffU) & 1) != 0
            ) {
        std::
        _Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
        ::operator*((_Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                     *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
                               *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
        if ((ppVar3->second).fromPeer != in_RCX) {
          std::
          vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
          ::
          emplace_back<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>const&>
                    (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        }
        std::
        _Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
        ::operator++((_Rb_tree_const_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      }
    }
    local_bc = local_bc + 1;
  }
  _Var6._M_current =
       (_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_> *)
       local_48;
  iVar4 = std::
          vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
          ::begin((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                   *)in_stack_fffffffffffffe70);
  iVar5 = std::
          vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
          ::end((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                 *)in_stack_fffffffffffffe70);
  std::
  sort<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>,TxOrphanage::IteratorComparator>
            (iVar4._M_current,iVar5._M_current);
  this_01 = local_48;
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ::begin((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
           *)in_stack_fffffffffffffe70);
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ::end((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
         *)in_stack_fffffffffffffe70);
  _Var6 = std::
          unique<__gnu_cxx::__normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>>
                    (_Var6,in_stack_fffffffffffffe90);
  __gnu_cxx::
  __normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>const*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>
  ::
  __normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*>
            ((__normal_iterator<const_std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
              *)in_stack_fffffffffffffe78,
             (__normal_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
              *)in_stack_fffffffffffffe70);
  this_00 = local_48;
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ::end((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
         *)in_stack_fffffffffffffe70);
  __gnu_cxx::
  __normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>const*,std::vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>>
  ::
  __normal_iterator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>*>
            ((__normal_iterator<const_std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
              *)this_00,
             (__normal_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
              *)in_stack_fffffffffffffe70);
  iVar4 = std::
          vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
          ::erase((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                   *)_Var6._M_current,__first,in_stack_fffffffffffffeb0);
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::vector((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
            *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ::size((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
          *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  std::
  vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
  ::reserve(in_stack_fffffffffffffea8,(size_type)in_stack_fffffffffffffea0._M_node);
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ::begin((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
           *)in_stack_fffffffffffffe70);
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ::end((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
         *)in_stack_fffffffffffffe70);
  while (bVar1 = __gnu_cxx::
                 operator==<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
                           ((__normal_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
                             *)this_00,
                            (__normal_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
                             *)in_stack_fffffffffffffe70), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
    ::operator*((__normal_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
                           *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    in_stack_fffffffffffffe70 = &ppVar3->second;
    std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>::
    operator->((_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
                *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    std::
    vector<std::pair<std::shared_ptr<CTransaction_const>,long>,std::allocator<std::pair<std::shared_ptr<CTransaction_const>,long>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>&,long&>
              ((vector<std::pair<std::shared_ptr<const_CTransaction>,_long>,_std::allocator<std::pair<std::shared_ptr<const_CTransaction>,_long>_>_>
                *)this_01,(shared_ptr<const_CTransaction> *)iVar4._M_current,(long *)this_00);
    __gnu_cxx::
    __normal_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
    ::operator++((__normal_iterator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_*,_std::vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  }
  std::
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ::~vector(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::pair<CTransactionRef, NodeId>> TxOrphanage::GetChildrenFromDifferentPeer(const CTransactionRef& parent, NodeId nodeid) const
{
    // First construct vector of iterators to ensure we do not return duplicates of the same tx.
    std::vector<OrphanMap::iterator> iters;

    // For each output, get all entries spending this prevout, filtering for ones not from the specified peer.
    for (unsigned int i = 0; i < parent->vout.size(); i++) {
        const auto it_by_prev = m_outpoint_to_orphan_it.find(COutPoint(parent->GetHash(), i));
        if (it_by_prev != m_outpoint_to_orphan_it.end()) {
            for (const auto& elem : it_by_prev->second) {
                if (elem->second.fromPeer != nodeid) {
                    iters.emplace_back(elem);
                }
            }
        }
    }

    // Erase duplicates
    std::sort(iters.begin(), iters.end(), IteratorComparator());
    iters.erase(std::unique(iters.begin(), iters.end()), iters.end());

    // Convert iterators to pair<CTransactionRef, NodeId>
    std::vector<std::pair<CTransactionRef, NodeId>> children_found;
    children_found.reserve(iters.size());
    for (const auto& child_iter : iters) {
        children_found.emplace_back(child_iter->second.tx, child_iter->second.fromPeer);
    }
    return children_found;
}